

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_history.c
# Opt level: O1

void fsg_history_entry_add
               (fsg_history_t *h,fsg_link_t *link,int32 frame,int32 score,int32 pred,int32 lc,
               fsg_pnode_ctxt_t rc)

{
  int iVar1;
  void *ptr;
  gnode_t *gn;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  gnode_t *pgVar5;
  glist_t pgVar6;
  gnode_t *pgVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  if (frame < 0) {
    puVar4 = (undefined8 *)
             __ckd_calloc__(1,0x28,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                            ,0x92);
    *puVar4 = link;
    *(int32 *)(puVar4 + 2) = frame;
    *(int32 *)(puVar4 + 1) = score;
    *(int32 *)((long)puVar4 + 0xc) = pred;
    *(short *)((long)puVar4 + 0x14) = (short)lc;
    puVar4[3] = rc.bv._0_8_;
    puVar4[4] = rc.bv._8_8_;
    blkarray_list_append(h->entries,puVar4);
    return;
  }
  iVar1 = link->to_state;
  pgVar7 = h->frame_entries[iVar1][lc];
  if (pgVar7 == (gnode_t *)0x0) {
    pgVar5 = (gnode_t *)0x0;
  }
  else {
    lVar10 = (pgVar7->data).i;
    if (*(int *)(lVar10 + 8) < score) {
      pgVar5 = (gnode_t *)0x0;
    }
    else {
      do {
        pgVar5 = pgVar7;
        rc.bv[0] = ~*(uint *)(lVar10 + 0x18) & rc.bv[0];
        rc.bv[1] = ~*(uint *)(lVar10 + 0x1c) & rc.bv[1];
        rc.bv[2] = ~*(uint *)(lVar10 + 0x20) & rc.bv[2];
        rc.bv[3] = ~*(uint *)(lVar10 + 0x24) & rc.bv[3];
        if (((rc.bv[1] == 0 && rc.bv[0] == 0) && rc.bv[2] == 0) && rc.bv[3] == 0) {
          return;
        }
        pgVar7 = pgVar5->next;
      } while ((pgVar7 != (gnode_s *)0x0) &&
              (lVar10 = (pgVar7->data).i, score <= *(int *)(lVar10 + 8)));
    }
  }
  puVar4 = (undefined8 *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                          ,0xb1);
  *puVar4 = link;
  *(int32 *)(puVar4 + 2) = frame;
  *(int32 *)(puVar4 + 1) = score;
  *(int32 *)((long)puVar4 + 0xc) = pred;
  *(short *)((long)puVar4 + 0x14) = (short)lc;
  puVar4[3] = CONCAT44(rc.bv[1],rc.bv[0]);
  puVar4[4] = CONCAT44(rc.bv[3],rc.bv[2]);
  if (pgVar5 == (gnode_t *)0x0) {
    pgVar6 = glist_add_ptr(h->frame_entries[iVar1][lc],puVar4);
    h->frame_entries[iVar1][lc] = pgVar6;
    pgVar5 = h->frame_entries[iVar1][lc];
  }
  else {
    pgVar5 = glist_insert_ptr(pgVar5,puVar4);
  }
  while (gn = pgVar7, gn != (gnode_t *)0x0) {
    ptr = (gn->data).ptr;
    uVar2 = ~rc.bv[0] & *(uint *)((long)ptr + 0x18);
    *(uint *)((long)ptr + 0x18) = uVar2;
    uVar8 = ~rc.bv[1] & *(uint *)((long)ptr + 0x1c);
    *(uint *)((long)ptr + 0x1c) = uVar8;
    uVar3 = ~rc.bv[2] & *(uint *)((long)ptr + 0x20);
    *(uint *)((long)ptr + 0x20) = uVar3;
    uVar9 = ~rc.bv[3] & *(uint *)((long)ptr + 0x24);
    *(uint *)((long)ptr + 0x24) = uVar9;
    if (uVar9 == 0 && (uVar3 == 0 && (uVar8 == 0 && uVar2 == 0))) {
      ckd_free(ptr);
      pgVar7 = gnode_free(gn,pgVar5);
    }
    else {
      pgVar7 = gn->next;
      pgVar5 = gn;
    }
  }
  return;
}

Assistant:

void
fsg_history_entry_add(fsg_history_t * h,
                      fsg_link_t * link,
                      int32 frame, int32 score, int32 pred,
                      int32 lc, fsg_pnode_ctxt_t rc)
{
    fsg_hist_entry_t *entry, *new_entry;
    int32 s;
    gnode_t *gn, *prev_gn;

    /* Skip the optimization for the initial dummy entries; always enter them */
    if (frame < 0) {
        new_entry =
            (fsg_hist_entry_t *) ckd_calloc(1, sizeof(fsg_hist_entry_t));
        new_entry->fsglink = link;
        new_entry->frame = frame;
        new_entry->score = score;
        new_entry->pred = pred;
        new_entry->lc = lc;
        new_entry->rc = rc;

        blkarray_list_append(h->entries, (void *) new_entry);
        return;
    }

    s = fsg_link_to_state(link);

    /* Locate where this entry should be inserted in frame_entries[s][lc] */
    prev_gn = NULL;
    for (gn = h->frame_entries[s][lc]; gn; gn = gnode_next(gn)) {
        entry = (fsg_hist_entry_t *) gnode_ptr(gn);

        if (score BETTER_THAN entry->score)
            break;              /* Found where to insert new entry */

        /* Existing entry score not worse than new score */
        if (FSG_PNODE_CTXT_SUB(&rc, &(entry->rc)) == 0)
            return;             /* rc set reduced to 0; new entry can be ignored */

        prev_gn = gn;
    }

    /* Create new entry after prev_gn (if prev_gn is NULL, at head) */
    new_entry =
        (fsg_hist_entry_t *) ckd_calloc(1, sizeof(fsg_hist_entry_t));
    new_entry->fsglink = link;
    new_entry->frame = frame;
    new_entry->score = score;
    new_entry->pred = pred;
    new_entry->lc = lc;
    new_entry->rc = rc;         /* Note: rc set must be non-empty at this point */

    if (!prev_gn) {
        h->frame_entries[s][lc] = glist_add_ptr(h->frame_entries[s][lc],
                                                (void *) new_entry);
        prev_gn = h->frame_entries[s][lc];
    }
    else
        prev_gn = glist_insert_ptr(prev_gn, (void *) new_entry);

    /*
     * Update the rc set of all the remaining entries in the list.  At this
     * point, gn is the entry, if any, immediately following new entry.
     */
    while (gn) {
        entry = (fsg_hist_entry_t *) gnode_ptr(gn);

        if (FSG_PNODE_CTXT_SUB(&(entry->rc), &rc) == 0) {
            /* rc set of entry reduced to 0; can prune this entry */
            ckd_free((void *) entry);
            gn = gnode_free(gn, prev_gn);
        }
        else {
            prev_gn = gn;
            gn = gnode_next(gn);
        }
    }
}